

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall
pstore::database::check_get_params(database *this,address addr,size_t size,bool writable)

{
  value_type vVar1;
  uint64_t uVar2;
  bool local_49;
  uint64_t logical_size;
  uint64_t start;
  undefined1 local_21;
  size_t sStack_20;
  bool writable_local;
  size_t size_local;
  database *this_local;
  address addr_local;
  
  local_21 = writable;
  sStack_20 = size;
  size_local = (size_t)this;
  this_local = (database *)addr.a_;
  if ((this->closed_ & 1U) != 0) {
    raise<pstore::error_code>(store_closed);
  }
  local_49 = false;
  if (writable) {
    start = (uint64_t)first_writable_address(this);
    local_49 = operator<((address *)&this_local,(address *)&start);
  }
  if (local_49 == false) {
    vVar1 = address::absolute((address *)&this_local);
    uVar2 = sizes::logical_size(&this->size_);
    if ((vVar1 <= uVar2) && (sStack_20 <= uVar2 - vVar1)) {
      return;
    }
    raise<pstore::error_code>(bad_address);
  }
  raise<pstore::error_code,char[50]>
            (read_only_address,(char (*) [50])"An attempt was made to write to read-only storage");
}

Assistant:

void database::check_get_params (address const addr, std::size_t const size,
                                     bool const writable) const {
        if (closed_) {
            raise (pstore::error_code::store_closed);
        }

        if (writable && addr < first_writable_address ()) {
            raise (error_code::read_only_address,
                   "An attempt was made to write to read-only storage");
        }
        std::uint64_t const start = addr.absolute ();
        std::uint64_t const logical_size = size_.logical_size ();
        if (start > logical_size || size > logical_size - start) {
            raise (error_code::bad_address);
        }
    }